

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O1

void __thiscall wallet::BerkeleyRODatabase::Open(BerkeleyRODatabase *this)

{
  undefined4 uVar1;
  pointer pbVar2;
  uint uVar3;
  bool bVar4;
  pointer pvVar5;
  uint32_t uVar6;
  ulong uVar7;
  int64_t iVar8;
  variant_alternative_t<0UL,_variant<DataRecord,_OverflowRecord>_> *pvVar9;
  runtime_error *prVar10;
  pointer pvVar11;
  size_t in_RCX;
  pointer pbVar12;
  pointer pvVar13;
  byte *pbVar14;
  uint uVar15;
  pointer pvVar16;
  uint *__args;
  int iVar17;
  undefined8 uVar18;
  ulong uVar19;
  long offset;
  long in_FS_OFFSET;
  bool bVar20;
  initializer_list<unsigned_int> __l;
  vector<std::byte,_std::allocator<std::byte>_> data;
  vector<std::byte,_std::allocator<std::byte>_> key;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pages;
  OverflowPage opage;
  PageHeader opage_header;
  RecordsPage rec_page;
  PageHeader header_1;
  RecordsPage page;
  PageHeader header;
  MetaPage inner_meta;
  MetaPage outer_meta;
  vector<std::byte,_std::allocator<std::byte>_> local_628;
  vector<std::byte,_std::allocator<std::byte>_> local_608;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_5f0;
  AutoFile local_5d8;
  PageHeader local_5b8;
  vector<std::byte,_std::allocator<std::byte>_> local_590;
  PageHeader local_578;
  RecordsPage local_548;
  PageHeader local_4ec;
  RecordsPage local_4c8;
  PageHeader local_46c;
  MetaPage local_448;
  MetaPage local_240;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_5d8.m_file = (FILE *)fsbridge::fopen((char *)&this->m_filepath,"rb");
  local_5d8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_5d8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5d8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((FILE *)local_5d8.m_file == (FILE *)0x0) {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"BerkeleyRODatabase: Failed to open database file");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_00598225;
  }
  local_240.expected_page_num = 0;
  MetaPage::Unserialize<AutoFile>(&local_240,&local_5d8);
  uVar7 = (ulong)local_240.pagesize;
  AutoFile::seek(&local_5d8,0,2);
  iVar8 = AutoFile::tell(&local_5d8);
  if (local_240.last_page == (int)(iVar8 / (long)uVar7) - 1U) {
    if (local_240.encrypt_algo == '\0') {
      if (local_240.last_page != 0) {
        offset = 0;
        uVar19 = 0;
        do {
          AutoFile::seek(&local_5d8,offset,0);
          AutoFile::read(&local_5d8,(int)&local_448,(void *)0x4,in_RCX);
          uVar6 = local_448.lsn_file;
          AutoFile::read(&local_5d8,(int)&local_448,(void *)0x4,in_RCX);
          in_RCX = (size_t)local_448.lsn_file;
          uVar15 = local_448.lsn_file >> 0x18 | (local_448.lsn_file & 0xff0000) >> 8 |
                   (local_448.lsn_file & 0xff00) << 8 | local_448.lsn_file << 0x18;
          if (local_240.other_endian == false) {
            uVar15 = local_448.lsn_file;
          }
          uVar3 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
          if (local_240.other_endian == false) {
            uVar3 = uVar6;
          }
          if ((uVar3 != 0) || (uVar15 != 1)) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (prVar10,
                       "LSNs are not reset, this database is not completely flushed. Please reopen then close the database with a version that has BDB support"
                      );
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_00598225;
          }
          uVar19 = uVar19 + 1;
          offset = offset + uVar7;
        } while (uVar19 < local_240.last_page);
      }
      AutoFile::seek(&local_5d8,local_240.root * uVar7,0);
      local_46c.expected_page_num = local_240.root;
      local_46c.other_endian = local_240.other_endian;
      PageHeader::Unserialize<AutoFile>(&local_46c,&local_5d8);
      if (local_46c.type == BTREE_LEAF) {
        if (local_46c.entries == 2) {
          local_4c8.m_header.other_endian = local_46c.other_endian;
          local_4c8.m_header._33_3_ = local_46c._33_3_;
          local_4c8.m_header.type = 5;
          local_4c8.m_header.level = local_46c.level;
          local_4c8.m_header._26_2_ = local_46c._26_2_;
          local_4c8.m_header.expected_page_num = local_46c.expected_page_num;
          local_4c8.m_header.lsn_file = local_46c.lsn_file;
          local_4c8.m_header.lsn_offset = local_46c.lsn_offset;
          local_4c8.m_header.page_num = local_46c.page_num;
          local_4c8.m_header.prev_page = local_46c.prev_page;
          local_4c8.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_4c8.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_4c8.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_4c8.records.
          super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (variant<wallet::DataRecord,_wallet::OverflowRecord> *)0x0;
          local_4c8.records.
          super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (variant<wallet::DataRecord,_wallet::OverflowRecord> *)0x0;
          local_4c8.records.
          super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          RecordsPage::Unserialize<AutoFile>(&local_4c8,&local_5d8);
          if (local_4c8.records.
              super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_4c8.records.
              super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar19 = 0;
            uVar18 = 0;
LAB_00597e91:
            if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00598225;
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar18,uVar19);
LAB_00597eb6:
            if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00598225;
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1
                      );
LAB_00597ee0:
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (prVar10,"Page number is greater than database last page");
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_00598225;
          }
          if (((local_4c8.records.
                super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Variant_base<wallet::DataRecord,_wallet::OverflowRecord>).
              super__Move_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>.
              super__Copy_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>.
              super__Move_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>.
              super__Copy_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>.
              super__Variant_storage_alias<wallet::DataRecord,_wallet::OverflowRecord>._M_index ==
              '\0') {
            pvVar9 = std::get<0ul,wallet::DataRecord,wallet::OverflowRecord>
                               (local_4c8.records.
                                super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
            pbVar12 = (pvVar9->data).super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pbVar2 = (pvVar9->data).super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            if ((long)pbVar2 - (long)pbVar12 != _DAT_00b4d098 - (long)SUBDATABASE_NAME)
            goto LAB_00597547;
            bVar20 = pbVar12 == pbVar2;
            if (!bVar20) {
              pbVar14 = SUBDATABASE_NAME;
              if (*pbVar12 == *SUBDATABASE_NAME) {
                do {
                  pbVar14 = pbVar14 + 1;
                  pbVar12 = pbVar12 + 1;
                  bVar20 = pbVar12 == pbVar2;
                  if (bVar20) goto LAB_00597590;
                } while (*pbVar12 == *pbVar14);
              }
              goto LAB_00597547;
            }
LAB_00597590:
            if (!bVar20) goto LAB_00597547;
            uVar19 = ((long)local_4c8.records.
                            super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_4c8.records.
                            super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
            if (uVar19 < 2) {
              uVar18 = 1;
              goto LAB_00597e91;
            }
            if ((local_4c8.records.
                 super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].
                 super__Variant_base<wallet::DataRecord,_wallet::OverflowRecord>.
                 super__Move_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                 super__Copy_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                 super__Move_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                 super__Copy_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                 super__Variant_storage_alias<wallet::DataRecord,_wallet::OverflowRecord>._M_index
                 == '\0') &&
               (pvVar9 = std::get<0ul,wallet::DataRecord,wallet::OverflowRecord>
                                   (local_4c8.records.
                                    super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1),
               (pvVar9->m_header).len == 4)) {
              if ((ulong)(((long)local_4c8.records.
                                 super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_4c8.records.
                                 super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x3333333333333333) < 2) goto LAB_00597eb6;
              pvVar9 = std::get<0ul,wallet::DataRecord,wallet::OverflowRecord>
                                 (local_4c8.records.
                                  super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1);
              uVar1 = *(undefined4 *)
                       (pvVar9->data).super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar15 = (uint)uVar1 >> 0x18 | (uint)(uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                       uVar1 << 0x18;
              if (uVar15 <= local_240.last_page) {
                AutoFile::seek(&local_5d8,uVar15 * uVar7,0);
                local_448.expected_page_num = uVar15;
                MetaPage::Unserialize<AutoFile>(&local_448,&local_5d8);
                if (local_448.pagesize == local_240.pagesize) {
                  if (local_240.last_page < local_448.last_page) {
                    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error
                              (prVar10,"Subdatabase last page is greater than database last page");
                  }
                  else {
                    if (local_448.encrypt_algo == '\0') {
                      local_548.m_header.lsn_file = local_448.root;
                      __l._M_len = 1;
                      __l._M_array = (iterator)&local_548;
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                                (&local_5f0,__l,(allocator_type *)&local_5b8);
                      if (local_5f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish !=
                          local_5f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start) {
                        do {
                          uVar15 = local_5f0.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish[-1];
                          local_5f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish =
                               local_5f0.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish + -1;
                          AutoFile::seek(&local_5d8,uVar15 * uVar7,0);
                          local_4ec.other_endian = local_448.other_endian;
                          local_4ec.expected_page_num = uVar15;
                          PageHeader::Unserialize<AutoFile>(&local_4ec,&local_5d8);
                          if (local_4ec.type == BTREE_INTERNAL) {
                            local_548.m_header.other_endian = local_4ec.other_endian;
                            local_548.m_header._33_3_ = local_4ec._33_3_;
                            local_548.m_header.type = 3;
                            local_548.m_header.level = local_4ec.level;
                            local_548.m_header._26_2_ = local_4ec._26_2_;
                            local_548.m_header.expected_page_num = local_4ec.expected_page_num;
                            local_548.m_header.next_page = local_4ec.next_page;
                            local_548.m_header.entries = local_4ec.entries;
                            local_548.m_header.hf_offset = local_4ec.hf_offset;
                            local_548.m_header.lsn_file = local_4ec.lsn_file;
                            local_548.m_header.lsn_offset = local_4ec.lsn_offset;
                            local_548.m_header.page_num = local_4ec.page_num;
                            local_548.m_header.prev_page = local_4ec.prev_page;
                            local_548.records.
                            super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                            local_548.records.
                            super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            local_548.indexes.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            local_548.records.
                            super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                            local_548.indexes.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                            local_548.indexes.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                            InternalPage::Unserialize<AutoFile>
                                      ((InternalPage *)&local_548,&local_5d8);
                            pvVar5 = local_548.records.
                                     super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                            if (local_548.records.
                                super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                                ._M_impl.super__Vector_impl_data._M_start !=
                                local_548.records.
                                super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish) {
                              __args = (uint *)((long)&((local_548.records.
                                                                                                                  
                                                  super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Variant_base<wallet::DataRecord,_wallet::OverflowRecord>
                                                  ).
                                                  super__Move_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                                  .
                                                  super__Copy_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                                  .
                                                  super__Move_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                                  .
                                                  super__Copy_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                                  .
                                                  super__Variant_storage_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                               + 8);
                              do {
                                if (*(char *)((long)__args + -5) == '\0') {
                                  if (local_5f0.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish ==
                                      local_5f0.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                                    std::vector<unsigned_int,std::allocator<unsigned_int>>::
                                    _M_realloc_insert<unsigned_int_const&>
                                              ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                                               &local_5f0,
                                               (iterator)
                                               local_5f0.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_finish,__args);
                                  }
                                  else {
                                    *local_5f0.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish = *__args;
                                    local_5f0.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish =
                                         local_5f0.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish + 1;
                                  }
                                }
                                pvVar13 = (pointer)(__args + 8);
                                __args = __args + 10;
                              } while (pvVar13 != pvVar5);
                            }
                            std::
                            vector<wallet::InternalRecord,_std::allocator<wallet::InternalRecord>_>
                            ::~vector((vector<wallet::InternalRecord,_std::allocator<wallet::InternalRecord>_>
                                       *)&local_548.records);
                            if (local_548.indexes.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                              operator_delete(local_548.indexes.
                                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              (long)local_548.indexes.
                                                                                                        
                                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)local_548.indexes.
                                                                                                            
                                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            }
                          }
                          else {
                            if (local_4ec.type != BTREE_LEAF) {
                              prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error(prVar10,"Unexpected page type");
                              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                __cxa_throw(prVar10,&std::runtime_error::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              goto LAB_00598225;
                            }
                            local_548.m_header.other_endian = local_4ec.other_endian;
                            local_548.m_header._33_3_ = local_4ec._33_3_;
                            local_548.m_header.type = 5;
                            local_548.m_header.level = local_4ec.level;
                            local_548.m_header._26_2_ = local_4ec._26_2_;
                            local_548.m_header.expected_page_num = local_4ec.expected_page_num;
                            local_548.m_header.next_page = local_4ec.next_page;
                            local_548.m_header.entries = local_4ec.entries;
                            local_548.m_header.hf_offset = local_4ec.hf_offset;
                            local_548.m_header.lsn_file = local_4ec.lsn_file;
                            local_548.m_header.lsn_offset = local_4ec.lsn_offset;
                            local_548.m_header.page_num = local_4ec.page_num;
                            local_548.m_header.prev_page = local_4ec.prev_page;
                            local_548.records.
                            super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                            local_548.records.
                            super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            local_548.indexes.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            local_548.records.
                            super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                            local_548.indexes.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                            local_548.indexes.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                            RecordsPage::Unserialize<AutoFile>(&local_548,&local_5d8);
                            pvVar5 = local_548.records.
                                     super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                            if (((uint)((int)local_548.records.
                                             super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (int)local_548.records.
                                            super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3 & 1) !=
                                0) {
                              prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error
                                        (prVar10,"Records page has odd number of records");
                              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                __cxa_throw(prVar10,&std::runtime_error::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              goto LAB_00598225;
                            }
                            local_608.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                            local_608.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                            local_608.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            if (local_548.records.
                                super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                                ._M_impl.super__Vector_impl_data._M_start !=
                                local_548.records.
                                super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish) {
                              bVar20 = true;
                              pvVar13 = local_548.records.
                                        super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish;
                              pvVar16 = local_548.records.
                                        super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                              do {
                                local_628.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                local_628.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                local_628.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                                if (pvVar16 == (pointer)0x0) {
                                  pvVar11 = (pointer)0x0;
                                }
                                else {
                                  pvVar11 = (pointer)0x0;
                                  if (*(__index_type *)
                                       ((long)&(pvVar16->
                                               super__Variant_base<wallet::DataRecord,_wallet::OverflowRecord>
                                               ).
                                               super__Move_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                               .
                                               super__Copy_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                               .
                                               super__Move_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                               .
                                               super__Copy_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                               .
                                               super__Variant_storage_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                       + 0x20) == '\0') {
                                    pvVar11 = pvVar16;
                                  }
                                }
                                if (pvVar11 == (pointer)0x0) {
                                  if (pvVar16 == (pointer)0x0) {
                                    pvVar11 = (pointer)0x0;
                                  }
                                  else {
                                    pvVar11 = (pointer)0x0;
                                    if (*(__index_type *)
                                         ((long)&(pvVar16->
                                                 super__Variant_base<wallet::DataRecord,_wallet::OverflowRecord>
                                                 ).
                                                 super__Move_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                                 .
                                                 super__Copy_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                                 .
                                                 super__Move_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                                 .
                                                 super__Copy_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                                 .
                                                 super__Variant_storage_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                         + 0x20) == '\x01') {
                                      pvVar11 = pvVar16;
                                    }
                                  }
                                  bVar4 = true;
                                  iVar17 = 0;
                                  if (pvVar11 != (pointer)0x0) {
                                    if (*(char *)((long)&(pvVar11->
                                                                                                                  
                                                  super__Variant_base<wallet::DataRecord,_wallet::OverflowRecord>
                                                  ).
                                                  super__Move_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                                  .
                                                  super__Copy_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                                  .
                                                  super__Move_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                                  .
                                                  super__Copy_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                                  .
                                                  super__Variant_storage_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                                  ._M_u + 3) == '\0') {
                                      uVar15 = *(uint *)((long)&(pvVar11->
                                                                                                                                
                                                  super__Variant_base<wallet::DataRecord,_wallet::OverflowRecord>
                                                  ).
                                                  super__Move_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                                  .
                                                  super__Copy_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                                  .
                                                  super__Move_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                                  .
                                                  super__Copy_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                                  .
                                                  super__Variant_storage_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                                  + 8);
                                      while (uVar15 != 0) {
                                        AutoFile::seek(&local_5d8,uVar15 * uVar7,0);
                                        local_578.other_endian = local_448.other_endian;
                                        local_578.expected_page_num = uVar15;
                                        PageHeader::Unserialize<AutoFile>(&local_578,&local_5d8);
                                        if (local_578.type != OVERFLOW_DATA) {
                                          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                                          std::runtime_error::runtime_error
                                                    (prVar10,"Bad overflow record page type");
                                          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                            __cxa_throw(prVar10,&std::runtime_error::typeinfo,
                                                        std::runtime_error::~runtime_error);
                                          }
                                          goto LAB_00598225;
                                        }
                                        local_5b8.other_endian = local_578.other_endian;
                                        local_5b8._33_3_ = local_578._33_3_;
                                        local_5b8.type = 7;
                                        local_5b8.level = local_578.level;
                                        local_5b8._26_2_ = local_578._26_2_;
                                        local_5b8.expected_page_num = local_578.expected_page_num;
                                        local_5b8.next_page = local_578.next_page;
                                        local_5b8.entries = local_578.entries;
                                        local_5b8.hf_offset = local_578.hf_offset;
                                        local_5b8.lsn_file = local_578.lsn_file;
                                        local_5b8.lsn_offset = local_578.lsn_offset;
                                        local_5b8.page_num = local_578.page_num;
                                        local_5b8.prev_page = local_578.prev_page;
                                        local_590.
                                        super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                        local_590.
                                        super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                        local_590.
                                        super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage =
                                             (pointer)0x0;
                                        std::vector<std::byte,_std::allocator<std::byte>_>::resize
                                                  (&local_590,(ulong)local_578._16_8_ >> 0x30);
                                        AutoFile::read(&local_5d8,
                                                       (int)local_590.
                                                                                                                        
                                                  super__Vector_base<std::byte,_std::allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (void *)((long)local_590.
                                                                                                                                  
                                                  super__Vector_base<std::byte,_std::allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_590.
                                                                                                                
                                                  super__Vector_base<std::byte,_std::allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start),
                                                  (size_t)pvVar13);
                                        pvVar13 = (pointer)local_590.
                                                                                                                      
                                                  super__Vector_base<std::byte,_std::allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                        std::vector<std::byte,std::allocator<std::byte>>::
                                        _M_range_insert<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,std::allocator<std::byte>>>>
                                                  ((vector<std::byte,std::allocator<std::byte>> *)
                                                   &local_628,
                                                   local_628.
                                                                                                      
                                                  super__Vector_base<std::byte,_std::allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish,
                                                  local_590.
                                                  super__Vector_base<std::byte,_std::allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                        uVar15 = local_578.next_page;
                                        if (local_590.
                                            super__Vector_base<std::byte,_std::allocator<std::byte>_>
                                            ._M_impl.super__Vector_impl_data._M_start !=
                                            (pointer)0x0) {
                                          operator_delete(local_590.
                                                                                                                    
                                                  super__Vector_base<std::byte,_std::allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_590.
                                                                                                                
                                                  super__Vector_base<std::byte,_std::allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_590.
                                                                                                                    
                                                  super__Vector_base<std::byte,_std::allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                        }
                                      }
                                    }
                                    else {
                                      iVar17 = 0xb;
                                      bVar4 = false;
                                    }
                                  }
                                  if (bVar4) goto LAB_00597979;
                                }
                                else {
                                  iVar17 = 0xb;
                                  if (*(char *)((long)&(pvVar11->
                                                                                                              
                                                  super__Variant_base<wallet::DataRecord,_wallet::OverflowRecord>
                                                  ).
                                                  super__Move_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                                  .
                                                  super__Copy_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                                  .
                                                  super__Move_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                                  .
                                                  super__Copy_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                                  .
                                                  super__Variant_storage_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                                  ._M_u + 3) == '\0') {
                                    std::vector<std::byte,_std::allocator<std::byte>_>::operator=
                                              (&local_628,
                                               (vector<std::byte,_std::allocator<std::byte>_> *)
                                               ((long)&(pvVar11->
                                                                                                              
                                                  super__Variant_base<wallet::DataRecord,_wallet::OverflowRecord>
                                                  ).
                                                  super__Move_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                                  .
                                                  super__Copy_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                                  .
                                                  super__Move_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                                  .
                                                  super__Copy_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                                  .
                                                  super__Variant_storage_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                               + 8));
LAB_00597979:
                                    iVar17 = 0;
                                  }
                                }
                                if (iVar17 == 0) {
                                  if (bVar20) {
                                    std::vector<std::byte,_std::allocator<std::byte>_>::operator=
                                              (&local_608,&local_628);
                                  }
                                  else {
                                    local_5b8.lsn_file = 0;
                                    local_5b8.lsn_offset = 0;
                                    local_5b8.page_num = 0;
                                    local_5b8.prev_page = 0;
                                    local_5b8.next_page = 0;
                                    local_5b8.entries = 0;
                                    local_5b8.hf_offset = 0;
                                    std::vector<std::byte,zero_after_free_allocator<std::byte>>::
                                    _M_range_initialize<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,std::allocator<std::byte>>>>
                                              ((vector<std::byte,zero_after_free_allocator<std::byte>>
                                                *)&local_5b8,
                                               local_608.
                                               super__Vector_base<std::byte,_std::allocator<std::byte>_>
                                               ._M_impl.super__Vector_impl_data._M_start,
                                               local_608.
                                               super__Vector_base<std::byte,_std::allocator<std::byte>_>
                                               ._M_impl.super__Vector_impl_data._M_finish);
                                    local_578.lsn_file = 0;
                                    local_578.lsn_offset = 0;
                                    local_578.page_num = 0;
                                    local_578.prev_page = 0;
                                    local_578.next_page = 0;
                                    local_578.entries = 0;
                                    local_578.hf_offset = 0;
                                    std::vector<std::byte,zero_after_free_allocator<std::byte>>::
                                    _M_range_initialize<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,std::allocator<std::byte>>>>
                                              ((vector<std::byte,zero_after_free_allocator<std::byte>>
                                                *)&local_578,
                                               local_628.
                                               super__Vector_base<std::byte,_std::allocator<std::byte>_>
                                               ._M_impl.super__Vector_impl_data._M_start,
                                               local_628.
                                               super__Vector_base<std::byte,_std::allocator<std::byte>_>
                                               ._M_impl.super__Vector_impl_data._M_finish);
                                    std::
                                    _Rb_tree<std::vector<std::byte,zero_after_free_allocator<std::byte>>,std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,std::_Select1st<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>,std::less<void>,std::allocator<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>>
                                    ::
                                    _M_emplace_unique<std::vector<std::byte,zero_after_free_allocator<std::byte>>,std::vector<std::byte,zero_after_free_allocator<std::byte>>>
                                              ((_Rb_tree<std::vector<std::byte,zero_after_free_allocator<std::byte>>,std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,std::_Select1st<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>,std::less<void>,std::allocator<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>>
                                                *)&this->m_records,
                                               (vector<std::byte,_zero_after_free_allocator<std::byte>_>
                                                *)&local_5b8,
                                               (vector<std::byte,_zero_after_free_allocator<std::byte>_>
                                                *)&local_578);
                                    std::
                                    _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::
                                    ~_Vector_base((
                                                  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                                  *)&local_578);
                                    std::
                                    _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::
                                    ~_Vector_base((
                                                  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                                  *)&local_5b8);
                                    if (local_608.
                                        super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                        _M_impl.super__Vector_impl_data._M_finish !=
                                        local_608.
                                        super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                        _M_impl.super__Vector_impl_data._M_start) {
                                      local_608.
                                      super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                      _M_impl.super__Vector_impl_data._M_finish =
                                           local_608.
                                           super__Vector_base<std::byte,_std::allocator<std::byte>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                                    }
                                  }
                                  bVar20 = (bool)(bVar20 ^ 1);
                                }
                                if (local_628.
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_628.
                                                  super__Vector_base<std::byte,_std::allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_628.
                                                                                                                
                                                  super__Vector_base<std::byte,_std::allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_628.
                                                                                                                    
                                                  super__Vector_base<std::byte,_std::allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                pvVar16 = pvVar16 + 1;
                              } while (pvVar16 != pvVar5);
                            }
                            if (local_608.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                              operator_delete(local_608.
                                              super__Vector_base<std::byte,_std::allocator<std::byte>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              (long)local_608.
                                                                                                        
                                                  super__Vector_base<std::byte,_std::allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)local_608.
                                                                                                            
                                                  super__Vector_base<std::byte,_std::allocator<std::byte>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            }
                            std::
                            vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                            ::~vector(&local_548.records);
                            if (local_548.indexes.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                              operator_delete(local_548.indexes.
                                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              (long)local_548.indexes.
                                                                                                        
                                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)local_548.indexes.
                                                                                                            
                                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            }
                          }
                        } while (local_5f0.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish !=
                                 local_5f0.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
                      }
                      if (local_5f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start != (uint *)0x0) {
                        operator_delete(local_5f0.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_5f0.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_5f0.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      std::
                      vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                      ::~vector(&local_4c8.records);
                      if (local_4c8.indexes.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_4c8.indexes.
                                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_4c8.indexes.
                                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_4c8.indexes.
                                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      AutoFile::~AutoFile(&local_5d8);
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                        return;
                      }
                      goto LAB_00598225;
                    }
                    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error
                              (prVar10,"BDB builtin encryption is not supported");
                  }
                }
                else {
                  prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar10,"Unexpected page size");
                }
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  __cxa_throw(prVar10,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                goto LAB_00598225;
              }
              goto LAB_00597ee0;
            }
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (prVar10,"Subdatabase page number has unexpected length");
          }
          else {
LAB_00597547:
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar10,"Subdatabase has an unexpected name");
          }
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00598225;
        }
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar10,"Unexpected number of entries in outer database root page");
      }
      else {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"Unexpected outer database root page type");
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00598225;
    }
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"BDB builtin encryption is not supported");
  }
  else {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"Last page number could not fit in file");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_00598225:
  __stack_chk_fail();
}

Assistant:

void BerkeleyRODatabase::Open()
{
    // Open the file
    FILE* file = fsbridge::fopen(m_filepath, "rb");
    AutoFile db_file(file);
    if (db_file.IsNull()) {
        throw std::runtime_error("BerkeleyRODatabase: Failed to open database file");
    }

    uint32_t page_size = 4096; // Default page size

    // Read the outer metapage
    // Expected page number is 0
    MetaPage outer_meta(0);
    db_file >> outer_meta;
    page_size = outer_meta.pagesize;

    // Verify the size of the file is a multiple of the page size
    db_file.seek(0, SEEK_END);
    int64_t size = db_file.tell();

    // Since BDB stores everything in a page, the file size should be a multiple of the page size;
    // However, BDB doesn't actually check that this is the case, and enforcing this check results
    // in us rejecting a database that BDB would not, so this check needs to be excluded.
    // This is left commented out as a reminder to not accidentally implement this in the future.
    // if (size % page_size != 0) {
    //     throw std::runtime_error("File size is not a multiple of page size");
    // }

    // Check the last page number
    uint32_t expected_last_page{uint32_t((size / page_size) - 1)};
    if (outer_meta.last_page != expected_last_page) {
        throw std::runtime_error("Last page number could not fit in file");
    }

    // Make sure encryption is disabled
    if (outer_meta.encrypt_algo != 0) {
        throw std::runtime_error("BDB builtin encryption is not supported");
    }

    // Check all Log Sequence Numbers (LSN) point to file 0 and offset 1 which indicates that the LSNs were
    // reset and that the log files are not necessary to get all of the data in the database.
    for (uint32_t i = 0; i < outer_meta.last_page; ++i) {
        // The LSN is composed of 2 32-bit ints, the first is a file id, the second an offset
        // It will always be the first 8 bytes of a page, so we deserialize it directly for every page
        uint32_t file;
        uint32_t offset;
        SeekToPage(db_file, i, page_size);
        db_file >> file >> offset;
        if (outer_meta.other_endian) {
            file = internal_bswap_32(file);
            offset = internal_bswap_32(offset);
        }
        if (file != 0 || offset != 1) {
            throw std::runtime_error("LSNs are not reset, this database is not completely flushed. Please reopen then close the database with a version that has BDB support");
        }
    }

    // Read the root page
    SeekToPage(db_file, outer_meta.root, page_size);
    PageHeader header(outer_meta.root, outer_meta.other_endian);
    db_file >> header;
    if (header.type != PageType::BTREE_LEAF) {
        throw std::runtime_error("Unexpected outer database root page type");
    }
    if (header.entries != 2) {
        throw std::runtime_error("Unexpected number of entries in outer database root page");
    }
    RecordsPage page(header);
    db_file >> page;

    // First record should be the string "main"
    if (!std::holds_alternative<DataRecord>(page.records.at(0)) || std::get<DataRecord>(page.records.at(0)).data != SUBDATABASE_NAME) {
        throw std::runtime_error("Subdatabase has an unexpected name");
    }
    // Check length of page number for subdatabase location
    if (!std::holds_alternative<DataRecord>(page.records.at(1)) || std::get<DataRecord>(page.records.at(1)).m_header.len != 4) {
        throw std::runtime_error("Subdatabase page number has unexpected length");
    }

    // Read subdatabase page number
    // It is written as a big endian 32 bit number
    uint32_t main_db_page = ReadBE32(UCharCast(std::get<DataRecord>(page.records.at(1)).data.data()));

    // The main database is in a page that doesn't exist
    if (main_db_page > outer_meta.last_page) {
        throw std::runtime_error("Page number is greater than database last page");
    }

    // Read the inner metapage
    SeekToPage(db_file, main_db_page, page_size);
    MetaPage inner_meta(main_db_page);
    db_file >> inner_meta;

    if (inner_meta.pagesize != page_size) {
        throw std::runtime_error("Unexpected page size");
    }

    if (inner_meta.last_page > outer_meta.last_page) {
        throw std::runtime_error("Subdatabase last page is greater than database last page");
    }

    // Make sure encryption is disabled
    if (inner_meta.encrypt_algo != 0) {
        throw std::runtime_error("BDB builtin encryption is not supported");
    }

    // Do a DFS through the BTree, starting at root
    std::vector<uint32_t> pages{inner_meta.root};
    while (pages.size() > 0) {
        uint32_t curr_page = pages.back();
        // It turns out BDB completely ignores this last_page field and doesn't actually update it to the correct
        // last page. While we should be checking this, we can't.
        // This is left commented out as a reminder to not accidentally implement this in the future.
        // if (curr_page > inner_meta.last_page) {
        //     throw std::runtime_error("Page number is greater than subdatabase last page");
        // }
        pages.pop_back();
        SeekToPage(db_file, curr_page, page_size);
        PageHeader header(curr_page, inner_meta.other_endian);
        db_file >> header;
        switch (header.type) {
        case PageType::BTREE_INTERNAL: {
            InternalPage int_page(header);
            db_file >> int_page;
            for (const InternalRecord& rec : int_page.records) {
                if (rec.m_header.deleted) continue;
                pages.push_back(rec.page_num);
            }
            break;
        }
        case PageType::BTREE_LEAF: {
            RecordsPage rec_page(header);
            db_file >> rec_page;
            if (rec_page.records.size() % 2 != 0) {
                // BDB stores key value pairs in consecutive records, thus an odd number of records is unexpected
                throw std::runtime_error("Records page has odd number of records");
            }
            bool is_key = true;
            std::vector<std::byte> key;
            for (const std::variant<DataRecord, OverflowRecord>& rec : rec_page.records) {
                std::vector<std::byte> data;
                if (const DataRecord* drec = std::get_if<DataRecord>(&rec)) {
                    if (drec->m_header.deleted) continue;
                    data = drec->data;
                } else if (const OverflowRecord* orec = std::get_if<OverflowRecord>(&rec)) {
                    if (orec->m_header.deleted) continue;
                    uint32_t next_page = orec->page_number;
                    while (next_page != 0) {
                        SeekToPage(db_file, next_page, page_size);
                        PageHeader opage_header(next_page, inner_meta.other_endian);
                        db_file >> opage_header;
                        if (opage_header.type != PageType::OVERFLOW_DATA) {
                            throw std::runtime_error("Bad overflow record page type");
                        }
                        OverflowPage opage(opage_header);
                        db_file >> opage;
                        data.insert(data.end(), opage.data.begin(), opage.data.end());
                        next_page = opage_header.next_page;
                    }
                }

                if (is_key) {
                    key = data;
                } else {
                    m_records.emplace(SerializeData{key.begin(), key.end()}, SerializeData{data.begin(), data.end()});
                    key.clear();
                }
                is_key = !is_key;
            }
            break;
        }
        default:
            throw std::runtime_error("Unexpected page type");
        }
    }
}